

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O3

shared_ptr<BER_CONTAINER> __thiscall StringCallback::buildTypeWithValue(StringCallback *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar1;
  undefined1 local_29;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  if (*(char ***)(in_RSI + 0x18) == (char **)0x0) {
    local_28._0_4_ = 0;
    local_28._4_4_ = 0;
    a_Stack_20[0]._M_pi._0_4_ = 0;
    a_Stack_20[0]._M_pi._4_4_ = 0;
  }
  else {
    local_28 = (OctetType *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OctetType,std::allocator<OctetType>,char*&>
              (a_Stack_20,(OctetType **)&local_28,(allocator<OctetType> *)&local_29,
               *(char ***)(in_RSI + 0x18));
    in_RDX._M_pi = extraout_RDX;
  }
  *(undefined4 *)&(this->super_ValueCallback)._vptr_ValueCallback = (undefined4)local_28;
  *(undefined4 *)((long)&(this->super_ValueCallback)._vptr_ValueCallback + 4) = local_28._4_4_;
  *(undefined4 *)&(this->super_ValueCallback).OID = a_Stack_20[0]._M_pi._0_4_;
  *(undefined4 *)((long)&(this->super_ValueCallback).OID + 4) = a_Stack_20[0]._M_pi._4_4_;
  sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> StringCallback::buildTypeWithValue(){
    ASSERT_VALID_VALUE(this->value);

    return std::make_shared<OctetType>(*this->value);
}